

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadBoneParent(OgreBinarySerializer *this,Skeleton *skeleton)

{
  DeadlyImportError *this_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar1;
  basic_formatter *this_01;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_50;
  Bone *local_30;
  Bone *parent;
  Bone *child;
  uint16_t parentId;
  Skeleton *pSStack_18;
  uint16_t childId;
  Skeleton *skeleton_local;
  OgreBinarySerializer *this_local;
  
  pSStack_18 = skeleton;
  skeleton_local = (Skeleton *)this;
  child._6_2_ = Read<unsigned_short>(this);
  child._4_2_ = Read<unsigned_short>(this);
  parent = Skeleton::BoneById(pSStack_18,child._6_2_);
  local_30 = Skeleton::BoneById(pSStack_18,child._4_2_);
  if ((parent != (Bone *)0x0) && (local_30 != (Bone *)0x0)) {
    Bone::AddChild(local_30,parent);
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
            (&local_1c8);
  pbVar1 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                      &local_1c8,(char (*) [46])"Failed to find bones for parenting: Child id ");
  pbVar1 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar1,(unsigned_short *)((long)&child + 6));
  pbVar1 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar1,(char (*) [16])" for parent id ");
  this_01 = (basic_formatter *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                      (pbVar1,(unsigned_short *)((long)&child + 4));
  Formatter::basic_formatter::operator_cast_to_string(&local_50,this_01);
  DeadlyImportError::DeadlyImportError(this_00,&local_50);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void OgreBinarySerializer::ReadBoneParent(Skeleton *skeleton)
{
    uint16_t childId = Read<uint16_t>();
    uint16_t parentId = Read<uint16_t>();

    Bone *child = skeleton->BoneById(childId);
    Bone *parent = skeleton->BoneById(parentId);

    if (child && parent)
        parent->AddChild(child);
    else
        throw DeadlyImportError(Formatter::format() << "Failed to find bones for parenting: Child id " << childId << " for parent id " << parentId);
}